

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tmat.c
# Opt level: O0

int32 tmat_chk_uppertri(tmat_t *tmat)

{
  int local_24;
  int local_20;
  int32 dst;
  int32 src;
  int32 i;
  tmat_t *tmat_local;
  
  dst = 0;
  do {
    if (tmat->n_tmat <= dst) {
      return 0;
    }
    for (local_24 = 0; local_20 = local_24, local_24 < tmat->n_state; local_24 = local_24 + 1) {
      while (local_20 = local_20 + 1, local_20 < tmat->n_state) {
        if (-0x38000000 < tmat->tp[dst][local_20][local_24]) {
          return -1;
        }
      }
    }
    dst = dst + 1;
  } while( true );
}

Assistant:

int32
tmat_chk_uppertri(tmat_t * tmat)
{
    int32 i, src, dst;

    /* Check that each tmat is upper-triangular */
    for (i = 0; i < tmat->n_tmat; i++) {
        for (dst = 0; dst < tmat->n_state; dst++)
            for (src = dst + 1; src < tmat->n_state; src++)
                if (tmat->tp[i][src][dst] > S3_LOGPROB_ZERO)
                    return -1;
    }

    return 0;
}